

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

int thread_pool_init(thread_pool_t *pool,size_t num_threads)

{
  int iVar1;
  pthread_mutex_t *ppVar2;
  void *pvVar3;
  thread **pptVar4;
  thread *__newthread;
  size_t sVar5;
  sigaction local_c8;
  
  if (pool == (thread_pool_t *)0x0) {
    thread_pool_init_cold_10();
  }
  else {
    pool->keepAlive = 1;
    pool->num_threads_alive = 0;
    pool->num_threads_working = 0;
    ppVar2 = (pthread_mutex_t *)malloc(0x48);
    pool->jobqueue = (jobqueue *)ppVar2;
    if (ppVar2 == (pthread_mutex_t *)0x0) {
      thread_pool_init_cold_9();
    }
    else {
      *(undefined8 *)((long)ppVar2 + 0x40) = 0;
      pvVar3 = malloc(0x60);
      ppVar2[1].__align = 0;
      *(undefined8 *)((long)ppVar2 + 0x30) = 0;
      *(void **)((long)ppVar2 + 0x38) = pvVar3;
      if (pvVar3 == (void *)0x0) {
        thread_pool_init_cold_7();
      }
      else {
        iVar1 = pthread_mutex_init(ppVar2,(pthread_mutexattr_t *)0x0);
        if (iVar1 == 0) {
          ppVar2 = *(pthread_mutex_t **)((long)ppVar2 + 0x38);
          pthread_mutex_init(ppVar2,(pthread_mutexattr_t *)0x0);
          pthread_cond_init((pthread_cond_t *)(ppVar2 + 1),(pthread_condattr_t *)0x0);
          *(undefined8 *)((long)ppVar2 + 0x58) = 0;
          pptVar4 = (thread **)malloc(num_threads * 8);
          pool->threads = pptVar4;
          if (pptVar4 == (thread **)0x0) {
            thread_pool_init_cold_6();
            return -1;
          }
          iVar1 = pthread_mutex_init((pthread_mutex_t *)&pool->thcount_lock,
                                     (pthread_mutexattr_t *)0x0);
          if (iVar1 == 0) {
            iVar1 = pthread_cond_init((pthread_cond_t *)&pool->threads_idle,
                                      (pthread_condattr_t *)0x0);
            if (iVar1 != 0) {
              thread_pool_init_cold_3();
              return -1;
            }
            memset(&local_c8,0,0x98);
            local_c8.sa_flags = 4;
            local_c8.__sigaction_handler.sa_handler = handler;
            iVar1 = sigaction(2,&local_c8,(sigaction *)0x0);
            if (iVar1 == -1) {
              thread_pool_init_cold_4();
            }
            if (num_threads != 0) {
              sVar5 = 0;
              do {
                pptVar4 = pool->threads;
                __newthread = (thread *)malloc(0x10);
                pptVar4[sVar5] = __newthread;
                if (__newthread == (thread *)0x0) {
                  thread_pool_init_cold_5();
                }
                else {
                  __newthread->thread_pool_p = pool;
                  pthread_create((pthread_t *)__newthread,(pthread_attr_t *)0x0,thread_do,
                                 __newthread);
                  pthread_detach(pptVar4[sVar5]->pthread);
                }
                sVar5 = sVar5 + 1;
              } while (num_threads != sVar5);
            }
            while (pool->num_threads_alive != num_threads) {
              usleep(100000);
            }
            iVar1 = vector_add(&vec,pool);
            pool->id = iVar1;
            return 0;
          }
          thread_pool_init_cold_2();
          return -1;
        }
        thread_pool_init_cold_1();
      }
      thread_pool_init_cold_8();
    }
  }
  return -1;
}

Assistant:

int thread_pool_init(thread_pool_t *pool, size_t num_threads) {
    if (pool == NULL) {
        err("thread_pool_init(): thread_pool is a null pointer.\n");
        return -1;
    }

    pool->keepAlive = 1;
    pool->num_threads_alive = 0;
    pool->num_threads_working = 0;

    /* ThreadPool should have a job queue */
    pool->jobqueue = malloc(sizeof(struct jobqueue));

    if (pool->jobqueue == NULL) {
        err("jobqueue_init(): Malloc failed for job queue.\n");
        return -1;
    }

    if (jobqueue_init(pool->jobqueue) == -1) {
        err("thread_pool_init(): Initialising job queue failed.\n");
        return -1;
    }

    /* Creating the threads in the thread pool */
    pool->threads = malloc(num_threads * sizeof(struct thread *));
    if (pool->threads == NULL) {
        err("thread_pool_init(): Malloc failed for creating threads\n");
        jobqueue_destroy(pool->jobqueue);
        free(pool);
        return -1;
    }

    /* Initialise mutex and condition in thread pool */
    if (pthread_mutex_init(&pool->thcount_lock, 0)) {
        err("thread_pool_init(): mutex initialisation failed.\n");
        jobqueue_destroy(pool->jobqueue);
        free(pool->threads);
        free(pool);
        return -1;
    }

    if (pthread_cond_init(&pool->threads_idle, 0) != 0) {
        err("thread_pool_init(): condition initialisation failed.\n");
        return -1;
    }

    set_sig_handler();

    for (size_t i = 0; i < num_threads; ++i) {
        thread_init(pool, &pool->threads[i]);
    }

    /* Waiting to all threads to be initialised */
    while (pool->num_threads_alive != num_threads) {
        usleep(100 * 1000);
    }

    int id = vector_add(&vec, pool);

    /* Id is the index of the pool in the vector of the pools. */
    pool->id = id;

    return 0;
}